

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O1

void __thiscall
Assimp::glTF2Exporter::GetTexSampler
          (glTF2Exporter *this,aiMaterial *mat,Ref<glTF2::Texture> texture,aiTextureType tt,
          uint slot)

{
  Texture *pTVar1;
  long lVar2;
  char *pcVar3;
  vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *pvVar4;
  size_type sVar5;
  aiMaterial *pMat;
  aiReturn aVar6;
  uint uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  Ref<glTF2::Sampler> RVar10;
  SamplerMinFilter filterMin;
  SamplerMagFilter filterMag;
  aiTextureMapMode mapV;
  aiTextureMapMode mapU;
  string id;
  aiString name;
  aiString aId;
  int local_878;
  int local_874;
  int local_870;
  int local_86c;
  vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *local_868;
  string local_860;
  aiMaterial *local_840;
  undefined1 local_838 [1028];
  aiString local_434;
  
  local_868 = texture.vector;
  uVar7 = texture.index;
  local_434.length = 0;
  local_434.data[0] = '\0';
  memset(local_434.data + 1,0x1b,0x3ff);
  local_860._M_dataplus._M_p = (pointer)&local_860.field_2;
  local_860._M_string_length = 0;
  local_860.field_2._M_local_buf[0] = '\0';
  local_840 = mat;
  aVar6 = aiGetMaterialString(mat,"$tex.mappingid",tt,slot,&local_434);
  sVar5 = local_860._M_string_length;
  if (aVar6 == aiReturn_SUCCESS) {
    strlen(local_434.data);
    std::__cxx11::string::_M_replace((ulong)&local_860,0,(char *)sVar5,(ulong)local_434.data);
  }
  RVar10 = glTF2::LazyDict<glTF2::Sampler>::Get
                     (&((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->samplers,local_860._M_dataplus._M_p);
  if (RVar10.vector == (vector<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_> *)0x0) {
    glTF2::Asset::FindUniqueID
              ((string *)local_838,
               (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &local_860,"sampler");
    std::__cxx11::string::operator=((string *)&local_860,(string *)local_838);
    if ((undefined1 *)CONCAT44(local_838._4_4_,local_838._0_4_) != local_838 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_838._4_4_,local_838._0_4_),local_838._16_8_ + 1);
    }
    RVar10 = glTF2::LazyDict<glTF2::Sampler>::Create
                       (&((this->mAsset).
                          super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         samplers,local_860._M_dataplus._M_p);
    pMat = local_840;
    pvVar4 = local_868;
    pTVar1 = (local_868->super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>).
             _M_impl.super__Vector_impl_data._M_start[uVar7];
    (pTVar1->sampler).vector = RVar10.vector;
    (pTVar1->sampler).index = RVar10.index;
    aVar6 = aiGetMaterialIntegerArray(local_840,"$tex.mapmodeu",tt,slot,&local_86c,(uint *)0x0);
    if (aVar6 == aiReturn_SUCCESS) {
      pTVar1 = (pvVar4->super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar7];
      uVar9 = 0x2901;
      if (local_86c == 2) {
        uVar9 = 0x8370;
      }
      uVar8 = 0x812f;
      if (local_86c != 1) {
        uVar8 = uVar9;
      }
      *(undefined4 *)
       (*(long *)(*(long *)&(((pTVar1->sampler).vector)->
                            super__Vector_base<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_>)
                            ._M_impl + (ulong)(pTVar1->sampler).index * 8) + 0x58) = uVar8;
    }
    aVar6 = aiGetMaterialIntegerArray(pMat,"$tex.mapmodev",tt,slot,&local_870,(uint *)0x0);
    if (aVar6 == aiReturn_SUCCESS) {
      pTVar1 = (pvVar4->super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar7];
      uVar9 = 0x2901;
      if (local_870 == 2) {
        uVar9 = 0x8370;
      }
      uVar8 = 0x812f;
      if (local_870 != 1) {
        uVar8 = uVar9;
      }
      *(undefined4 *)
       (*(long *)(*(long *)&(((pTVar1->sampler).vector)->
                            super__Vector_base<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_>)
                            ._M_impl + (ulong)(pTVar1->sampler).index * 8) + 0x5c) = uVar8;
    }
    aVar6 = aiGetMaterialIntegerArray(pMat,"$tex.mappingfiltermag",tt,slot,&local_874,(uint *)0x0);
    if (aVar6 == aiReturn_SUCCESS) {
      pTVar1 = (pvVar4->super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar7];
      *(int *)(*(long *)(*(long *)&(((pTVar1->sampler).vector)->
                                   super__Vector_base<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_>
                                   )._M_impl + (ulong)(pTVar1->sampler).index * 8) + 0x50) =
           local_874;
    }
    aVar6 = aiGetMaterialIntegerArray(pMat,"$tex.mappingfiltermin",tt,slot,&local_878,(uint *)0x0);
    if (aVar6 == aiReturn_SUCCESS) {
      pTVar1 = (pvVar4->super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar7];
      *(int *)(*(long *)(*(long *)&(((pTVar1->sampler).vector)->
                                   super__Vector_base<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_>
                                   )._M_impl + (ulong)(pTVar1->sampler).index * 8) + 0x54) =
           local_878;
    }
    local_838._0_4_ = 0;
    local_838._4_4_ = local_838._4_4_ & 0xffffff00;
    memset(local_838 + 5,0x1b,0x3ff);
    aVar6 = aiGetMaterialString(pMat,"$tex.mappingname",tt,slot,(aiString *)local_838);
    if (aVar6 == aiReturn_SUCCESS) {
      pTVar1 = (pvVar4->super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar7];
      lVar2 = *(long *)(*(long *)&(((pTVar1->sampler).vector)->
                                  super__Vector_base<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_>
                                  )._M_impl + (ulong)(pTVar1->sampler).index * 8);
      pcVar3 = *(char **)(lVar2 + 0x38);
      strlen(local_838 + 4);
      std::__cxx11::string::_M_replace(lVar2 + 0x30,0,pcVar3,(ulong)(local_838 + 4));
    }
  }
  else {
    pTVar1 = (local_868->super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>).
             _M_impl.super__Vector_impl_data._M_start[uVar7];
    (pTVar1->sampler).vector = RVar10.vector;
    (pTVar1->sampler).index = RVar10.index;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_860._M_dataplus._M_p != &local_860.field_2) {
    operator_delete(local_860._M_dataplus._M_p,
                    CONCAT71(local_860.field_2._M_allocated_capacity._1_7_,
                             local_860.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void glTF2Exporter::GetTexSampler(const aiMaterial* mat, Ref<Texture> texture, aiTextureType tt, unsigned int slot)
{
    aiString aId;
    std::string id;
    if (aiGetMaterialString(mat, AI_MATKEY_GLTF_MAPPINGID(tt, slot), &aId) == AI_SUCCESS) {
        id = aId.C_Str();
    }

    if (Ref<Sampler> ref = mAsset->samplers.Get(id.c_str())) {
        texture->sampler = ref;
    } else {
        id = mAsset->FindUniqueID(id, "sampler");

        texture->sampler = mAsset->samplers.Create(id.c_str());

        aiTextureMapMode mapU, mapV;
        SamplerMagFilter filterMag;
        SamplerMinFilter filterMin;

        if (aiGetMaterialInteger(mat, AI_MATKEY_MAPPINGMODE_U(tt, slot), (int*)&mapU) == AI_SUCCESS) {
            SetSamplerWrap(texture->sampler->wrapS, mapU);
        }

        if (aiGetMaterialInteger(mat, AI_MATKEY_MAPPINGMODE_V(tt, slot), (int*)&mapV) == AI_SUCCESS) {
            SetSamplerWrap(texture->sampler->wrapT, mapV);
        }

        if (aiGetMaterialInteger(mat, AI_MATKEY_GLTF_MAPPINGFILTER_MAG(tt, slot), (int*)&filterMag) == AI_SUCCESS) {
            texture->sampler->magFilter = filterMag;
        }

        if (aiGetMaterialInteger(mat, AI_MATKEY_GLTF_MAPPINGFILTER_MIN(tt, slot), (int*)&filterMin) == AI_SUCCESS) {
            texture->sampler->minFilter = filterMin;
        }

        aiString name;
        if (aiGetMaterialString(mat, AI_MATKEY_GLTF_MAPPINGNAME(tt, slot), &name) == AI_SUCCESS) {
            texture->sampler->name = name.C_Str();
        }
    }
}